

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qstylesheetstyle_p.cpp
# Opt level: O0

void QStyleSheetStyleCaches::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  QStyleSheetStyleCaches *in_RDI;
  QStyleSheetStyleCaches *_t;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      objectDestroyed(in_RDI,&_t->super_QObject);
    }
    else if (in_EDX == 1) {
      styleDestroyed(in_RDI,(QObject *)CONCAT44(1,in_stack_ffffffffffffffd8));
    }
  }
  return;
}

Assistant:

void QStyleSheetStyleCaches::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QStyleSheetStyleCaches *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->objectDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        case 1: _t->styleDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
}